

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O2

void __thiscall DIS::SeesPdu::marshal(SeesPdu *this,DataStream *dataStream)

{
  pointer pPVar1;
  pointer pVVar2;
  long lVar3;
  ulong uVar4;
  PropulsionSystemData x;
  
  DistributedEmissionsFamilyPdu::marshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::marshal(&this->_orginatingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_infraredSignatureRepresentationIndex);
  DataStream::operator<<(dataStream,this->_acousticSignatureRepresentationIndex);
  DataStream::operator<<(dataStream,this->_radarCrossSectionSignatureRepresentationIndex);
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_propulsionSystemData).
                              super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_propulsionSystemData).
                             super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_vectoringSystemData).
                              super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_vectoringSystemData).
                             super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4));
  lVar3 = 8;
  for (uVar4 = 0;
      pPVar1 = (this->_propulsionSystemData).
               super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->_propulsionSystemData).
                            super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 4);
      uVar4 = uVar4 + 1) {
    x._vptr_PropulsionSystemData = (_func_int **)&PTR__PropulsionSystemData_001c28d8;
    x._8_8_ = *(undefined8 *)((long)&pPVar1->_vptr_PropulsionSystemData + lVar3);
    PropulsionSystemData::marshal(&x,dataStream);
    PropulsionSystemData::~PropulsionSystemData(&x);
    lVar3 = lVar3 + 0x10;
  }
  lVar3 = 8;
  for (uVar4 = 0;
      pVVar2 = (this->_vectoringSystemData).
               super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->_vectoringSystemData).
                            super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4);
      uVar4 = uVar4 + 1) {
    x._vptr_PropulsionSystemData = (_func_int **)&PTR__VectoringNozzleSystem_001c37d8;
    x._8_8_ = *(undefined8 *)((long)&pVVar2->_vptr_VectoringNozzleSystem + lVar3);
    VectoringNozzleSystem::marshal((VectoringNozzleSystem *)&x,dataStream);
    VectoringNozzleSystem::~VectoringNozzleSystem((VectoringNozzleSystem *)&x);
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void SeesPdu::marshal(DataStream& dataStream) const
{
    DistributedEmissionsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _orginatingEntityID.marshal(dataStream);
    dataStream << _infraredSignatureRepresentationIndex;
    dataStream << _acousticSignatureRepresentationIndex;
    dataStream << _radarCrossSectionSignatureRepresentationIndex;
    dataStream << ( unsigned short )_propulsionSystemData.size();
    dataStream << ( unsigned short )_vectoringSystemData.size();

     for(size_t idx = 0; idx < _propulsionSystemData.size(); idx++)
     {
        PropulsionSystemData x = _propulsionSystemData[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _vectoringSystemData.size(); idx++)
     {
        VectoringNozzleSystem x = _vectoringSystemData[idx];
        x.marshal(dataStream);
     }

}